

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::csharp::GetPropertyName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *descriptor)

{
  size_t __n;
  int iVar1;
  string local_38;
  
  GetFieldName_abi_cxx11_(&local_38,this,descriptor);
  UnderscoresToCamelCase(__return_storage_ptr__,&local_38,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  __n = __return_storage_ptr__->_M_string_length;
  if ((((__n != ((undefined8 *)**(long **)(this + 0x58))[1]) ||
       ((__n != 0 &&
        (iVar1 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,*(void **)**(long **)(this + 0x58),
                      __n), iVar1 != 0)))) &&
      (iVar1 = std::__cxx11::string::compare((char *)__return_storage_ptr__), iVar1 != 0)) &&
     (iVar1 = std::__cxx11::string::compare((char *)__return_storage_ptr__), iVar1 != 0)) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GetPropertyName(const FieldDescriptor* descriptor) {
  // TODO(jtattermusch): consider introducing csharp_property_name field option
  std::string property_name = UnderscoresToPascalCase(GetFieldName(descriptor));
  // Avoid either our own type name or reserved names. Note that not all names
  // are reserved - a field called to_string, write_to etc would still cause a problem.
  // There are various ways of ending up with naming collisions, but we try to avoid obvious
  // ones.
  if (property_name == descriptor->containing_type()->name()
      || property_name == "Types"
      || property_name == "Descriptor") {
    property_name += "_";
  }
  return property_name;
}